

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

void If_CluCheckGroup(word *pTruth,int nVars,If_Grp_t *g)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int nVars_00;
  int P2V [16];
  int V2P [16];
  word pF [1024];
  int local_20a8 [16];
  int local_2068 [16];
  word local_2028 [1025];
  
  if (4 < (byte)(g->nVars - 2U)) {
    __assert_fail("g->nVars >= 2 && g->nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x590,"void If_CluCheckGroup(word *, int, If_Grp_t *)");
  }
  if ((byte)(g->nMyu - 2U) < 3) {
    if (0 < nVars) {
      uVar3 = 0;
      do {
        local_20a8[uVar3] = (int)uVar3;
        local_2068[uVar3] = (int)uVar3;
        uVar3 = uVar3 + 1;
      } while ((uint)nVars != uVar3);
    }
    uVar1 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar1 = 1;
    }
    if (0 < (int)uVar1) {
      memcpy(local_2028,pTruth,(ulong)uVar1 << 3);
    }
    If_CluMoveGroupToMsb(local_2028,nVars,local_2068,local_20a8,g);
    iVar2 = If_CluCountCofs(local_2028,nVars,(int)g->nVars,0,(word (*) [256])0x0);
    if (iVar2 != g->nMyu) {
      puts("Group check 0 has failed.");
    }
    if (2 < iVar2) {
      nVars_00 = nVars + -1;
      iVar2 = If_CluCountCofs(local_2028,nVars_00,g->nVars + -1,0,(word (*) [256])0x0);
      if (2 < iVar2) {
        puts("Group check 1 has failed.");
      }
      iVar2 = If_CluCountCofs(local_2028,nVars_00,g->nVars + -1,1 << ((byte)nVars_00 & 0x1f),
                              (word (*) [256])0x0);
      if (2 < iVar2) {
        puts("Group check 2 has failed.");
        return;
      }
    }
    return;
  }
  __assert_fail("g->nMyu >= 2 && g->nMyu <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x591,"void If_CluCheckGroup(word *, int, If_Grp_t *)");
}

Assistant:

void If_CluCheckGroup( word * pTruth, int nVars, If_Grp_t * g )
{
    word pF[CLU_WRD_MAX];
    int v, nCofs, V2P[CLU_VAR_MAX], P2V[CLU_VAR_MAX];
    assert( g->nVars >= 2 && g->nVars <= 6 ); // vars
    assert( g->nMyu >= 2 && g->nMyu <= 4 ); // cofs
    // create permutation
    for ( v = 0; v < nVars; v++ )
        V2P[v] = P2V[v] = v;
    // create truth table
    If_CluCopy( pF, pTruth, nVars );
    // move group up
    If_CluMoveGroupToMsb( pF, nVars, V2P, P2V, g );
    // check the number of cofactors
    nCofs = If_CluCountCofs( pF, nVars, g->nVars, 0, NULL );
    if ( nCofs != g->nMyu )
        printf( "Group check 0 has failed.\n" );
    // check compatible
    if ( nCofs > 2 )
    {
        nCofs = If_CluCountCofs( pF, nVars-1, g->nVars-1, 0, NULL );
        if ( nCofs > 2 )
            printf( "Group check 1 has failed.\n" );
        nCofs = If_CluCountCofs( pF, nVars-1, g->nVars-1, (1 << (nVars-1)), NULL );
        if ( nCofs > 2 )
            printf( "Group check 2 has failed.\n" );
    }
}